

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_35b0::ApproxCheck::checkUseChain
          (ApproxCheck *this,Instruction *instr,int level,
          vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *history)

{
  undefined8 instr_00;
  bool bVar1;
  char *pcVar2;
  op_iterator pUVar3;
  byte local_132;
  Value *local_d8;
  Value *evalAddrInst;
  byte local_b1;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_b0;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string newopcode;
  Instruction *vi;
  op_iterator i;
  bool skipFirst;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string opcode;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *history_local;
  int level_local;
  Instruction *instr_local;
  ApproxCheck *this_local;
  
  opcode.field_2._8_8_ = history;
  pcVar2 = llvm::Instruction::getOpcodeName(instr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcVar2,&local_49);
  std::allocator<char>::~allocator(&local_49);
  i._3_1_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"store");
  for (vi = (Instruction *)llvm::User::op_begin((User *)instr);
      pUVar3 = llvm::User::op_end((User *)instr), vi != (Instruction *)pUVar3; vi = vi + 0x20) {
    if (i._3_1_ == false) {
      bVar1 = llvm::isa<llvm::Instruction,llvm::Use>((Use *)vi);
      if (bVar1) {
        newopcode.field_2._8_8_ = llvm::dyn_cast<llvm::Instruction,llvm::Use>((Use *)vi);
        markInstruction(this,(Instruction *)newopcode.field_2._8_8_);
        pcVar2 = llvm::Instruction::getOpcodeName((Instruction *)newopcode.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,pcVar2,&local_91);
        std::allocator<char>::~allocator(&local_91);
        local_b1 = 0;
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"load");
        local_132 = 0;
        if (bVar1) {
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    (&local_b0,history);
          local_b1 = 1;
          bVar1 = vectorContains(this,&local_b0,(Instruction *)newopcode.field_2._8_8_);
          local_132 = bVar1 ^ 0xff;
        }
        if ((local_b1 & 1) != 0) {
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~vector(&local_b0)
          ;
        }
        if ((local_132 & 1) != 0) {
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::push_back
                    (history,(value_type *)((long)&newopcode.field_2 + 8));
          instr_00 = newopcode.field_2._8_8_;
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)
                     &evalAddrInst,history);
          checkUseChain(this,(Instruction *)instr_00,level + 1,
                        (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)
                        &evalAddrInst);
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~vector
                    ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)
                     &evalAddrInst);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"load");
        if (bVar1) {
          local_d8 = findAddressDependency(this,(Instruction *)newopcode.field_2._8_8_);
          bVar1 = isInAddrList(this,local_d8);
          if (!bVar1) {
            std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
                      (&this->addrList,&local_d8);
          }
        }
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    else {
      i._3_1_ = false;
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void checkUseChain(Instruction* instr, int level, std::vector<Instruction*> history) {
			std::string opcode = instr->getOpcodeName();
			bool skipFirst = (opcode == "store");

			for (User::op_iterator i = instr->op_begin(); i != instr->op_end(); i++) {
				if (skipFirst) {
					skipFirst = false;
				} else if (isa<Instruction>(*i)) {
					Instruction *vi = dyn_cast<Instruction>(*i);
					markInstruction(vi);

					// Print
					// for (int j = 0; j < level; j++) { errs() << "\t"; }
					// errs() << "(" << level << ")" << *vi << "\n";

					std::string newopcode = vi->getOpcodeName();
					if (newopcode != "load" && !vectorContains(history, vi)) {
						history.push_back(vi);
						ApproxCheck::checkUseChain(vi, level + 1, history);
					}

					if (newopcode == "load") {
						// Found some "address" stored in memory.
						Value* evalAddrInst = findAddressDependency(vi);
						if(!isInAddrList(evalAddrInst)) {
							addrList.push_back(evalAddrInst);
						}
					}
				}
			}
		}